

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printStructs(PrinterStream *this)

{
  RefCountedPtr<soul::Structure> *pRVar1;
  Structure *s_00;
  RefCountedPtr<soul::Structure> *s;
  RefCountedPtr<soul::Structure> *__end2;
  RefCountedPtr<soul::Structure> *__begin2;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> *local_18;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> *__range2;
  PrinterStream *this_local;
  
  __range2 = (ArrayView<soul::RefCountedPtr<soul::Structure>_> *)this;
  ___begin2 = Module::Structs::get(&this->module->structs);
  local_18 = (ArrayView<soul::RefCountedPtr<soul::Structure>_> *)&__begin2;
  __end2 = ArrayView<soul::RefCountedPtr<soul::Structure>_>::begin(local_18);
  pRVar1 = ArrayView<soul::RefCountedPtr<soul::Structure>_>::end(local_18);
  for (; __end2 != pRVar1; __end2 = __end2 + 1) {
    s_00 = RefCountedPtr<soul::Structure>::operator*(__end2);
    printStruct(this,s_00);
  }
  return;
}

Assistant:

void printStructs()
        {
            for (auto& s : module.structs.get())
                printStruct (*s);
        }